

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_Poly1305_64.c
# Opt level: O0

void Hacl_Poly1305_64_finish(Hacl_Impl_Poly1305_64_State_poly1305_state st,uint8_t *mac,uint8_t *k1)

{
  undefined1 n [16];
  uint128_t *puVar1;
  uint8_t *b;
  long extraout_RDX;
  ulong *in_RSI;
  FStar_UInt128_t mac_;
  FStar_UInt128_t acc_;
  uint64_t h2;
  uint64_t h1;
  uint64_t h0;
  FStar_UInt128_t k_;
  uint64_t *acc;
  uint64_t *h;
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut;
  uint8_t *in_stack_ffffffffffffff68;
  
  puVar1 = load128_le(in_stack_ffffffffffffff68);
  b = (uint8_t *)(in_RSI[1] << 0x2c | *in_RSI);
  n._8_8_ = b + (long)puVar1;
  n._0_8_ = (in_RSI[2] << 0x18 | in_RSI[1] >> 0x14) + extraout_RDX +
            (ulong)CARRY8((ulong)b,(ulong)puVar1);
  store128_le(b,(uint128_t)n);
  return;
}

Assistant:

void
Hacl_Poly1305_64_finish(
  Hacl_Impl_Poly1305_64_State_poly1305_state st,
  uint8_t *mac,
  uint8_t *k1
)
{
  Hacl_Impl_Poly1305_64_State_poly1305_state scrut = st;
  uint64_t *h = scrut.h;
  uint64_t *acc = h;
  FStar_UInt128_t k_ = load128_le(k1);
  uint64_t h0 = acc[0U];
  uint64_t h1 = acc[1U];
  uint64_t h2 = acc[2U];
  FStar_UInt128_t
  acc_ =
    FStar_UInt128_logor(FStar_UInt128_shift_left(FStar_UInt128_uint64_to_uint128(h2
          << (uint32_t)24U
          | h1 >> (uint32_t)20U),
        (uint32_t)64U),
      FStar_UInt128_uint64_to_uint128(h1 << (uint32_t)44U | h0));
  FStar_UInt128_t mac_ = FStar_UInt128_add_mod(acc_, k_);
  store128_le(mac, mac_);
}